

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warrior.cpp
# Opt level: O2

void __thiscall warrior::addKill(warrior *this,entity *zombieKilled)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  allocator local_8b;
  allocator local_8a;
  allocator local_89;
  string labels [3];
  
  iVar1 = entity::getSize(zombieKilled);
  this->score = this->score + *(int *)(&DAT_0010718c + (long)iVar1 * 4);
  std::__cxx11::string::string((string *)labels,"Small Zombie",&local_89);
  std::__cxx11::string::string((string *)(labels + 1),"Medium Zombie",&local_8a);
  std::__cxx11::string::string((string *)(labels + 2),"Large Zombie",&local_8b);
  if ((this->killList)._M_string_length != 0) {
    std::__cxx11::string::append((char *)&this->killList);
  }
  std::__cxx11::string::append((string *)&this->killList);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)(labels + (long)iVar1 + -1));
  std::operator<<(poVar2," Slain!\n");
  lVar3 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&labels[0]._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  return;
}

Assistant:

void warrior::addKill(entity *zombieKilled) {
    //function to automatically update score and killList from zombie entity
    //also will keep track of katana Leveling
    //note: as of writing, the function will also delete zombie object, may change later

    int size = zombieKilled->getSize() - 1;
    int scores[3] = {50, 75, 100};
    addScore(scores[size]);

    std::string labels[3] = {"Small Zombie", "Medium Zombie", "Large Zombie"};
    if (!killList.empty())
        killList += ",";

    killList += labels[size];

    std::cout << labels[size] << " Slain!\n";
}